

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalRangeJoin::GlobalSortedTable::IntializeMatches(GlobalSortedTable *this)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  _Head_base<0UL,_bool_*,_false> __s;
  
  __s._M_head_impl = (bool *)operator_new__((this->count).super___atomic_base<unsigned_long>._M_i);
  _Var1._M_head_impl =
       (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = __s._M_head_impl;
  if (_Var1._M_head_impl != (bool *)0x0) {
    operator_delete__(_Var1._M_head_impl);
    __s._M_head_impl =
         (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  }
  switchD_01043a80::default
            (__s._M_head_impl,0,(this->count).super___atomic_base<unsigned_long>._M_i);
  return;
}

Assistant:

void PhysicalRangeJoin::GlobalSortedTable::IntializeMatches() {
	found_match = make_unsafe_uniq_array_uninitialized<bool>(Count());
	memset(found_match.get(), 0, sizeof(bool) * Count());
}